

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O1

basic_string_view<char,_std::char_traits<char>_> *
frozen::bits::
lower_bound<5ul,std::basic_string_view<char,std::char_traits<char>>const*,std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>>
          (basic_string_view<char,_std::char_traits<char>_> *first,
          basic_string_view<char,_std::char_traits<char>_> *value,
          less<std::basic_string_view<char,_std::char_traits<char>_>_> *compare)

{
  _Cat _Var1;
  ulong uVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  _Var1 = std::operator<=><char,std::char_traits<char>>(first[3],*value);
  if (_Var1._M_value < '\0') {
    _Var1 = std::operator<=><char,std::char_traits<char>>(first[4],*value);
    uVar2 = 0x40;
  }
  else {
    _Var1 = std::operator<=><char,std::char_traits<char>>(first[1],*value);
    uVar2 = (ulong)((byte)_Var1._M_value >> 2 & 0x20);
    __x._M_str = *(char **)((long)&first->_M_str + uVar2);
    __x._M_len = *(size_t *)((long)&first->_M_len + uVar2);
    _Var1 = std::operator<=><char,std::char_traits<char>>(__x,*value);
  }
  return (basic_string_view<char,_std::char_traits<char>_> *)
         ((long)&first->_M_len + ((byte)_Var1._M_value >> 3 & 0x10) + uVar2);
}

Assistant:

constexpr ForwardIt lower_bound(ForwardIt first, const T &value, Compare const &compare) {
  return LowerBound<T, Compare>{value, compare}.doitfirst(first, std::integral_constant<std::size_t, N>{}, std::integral_constant<bool, next_highest_power_of_two(N) - 1 == N>{});
}